

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_bind_syntax(sexp ls,sexp eval_ctx,sexp bind_ctx,int localp)

{
  sexp_tag_t sVar1;
  int iVar2;
  sexp psVar3;
  sexp psVar4;
  char *message;
  sexp tmp;
  sexp local_60;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &local_60;
  local_60 = (sexp)&DAT_0000043e;
  local_40.var = &local_58;
  local_58 = (sexp)&DAT_0000043e;
  local_40.next = &local_50;
  local_50.next = (eval_ctx->value).context.saves;
  (eval_ctx->value).context.saves = &local_40;
  do {
    if ((((ulong)ls & 3) != 0) || (ls->tag != 6)) {
      local_60 = (sexp)&DAT_0000043e;
LAB_0012cba0:
      (eval_ctx->value).context.saves = local_50.next;
      return local_60;
    }
    psVar3 = (ls->value).type.name;
    if ((((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 6)) ||
        (psVar4 = (psVar3->value).type.cpl, ((ulong)psVar4 & 3) != 0)) || (psVar4->tag != 6)) {
LAB_0012cb8b:
      message = "bad syntax binding";
LAB_0012cb92:
      local_60 = sexp_compile_error(eval_ctx,message,psVar3);
      goto LAB_0012cba0;
    }
    iVar2 = sexp_idp((psVar3->value).type.name);
    if ((iVar2 == 0) || ((psVar4->value).type.cpl != (sexp)0x23e)) goto LAB_0012cb8b;
    psVar3 = (psVar4->value).type.name;
    iVar2 = sexp_idp(psVar3);
    if (iVar2 == 0) {
      psVar3 = sexp_eval_op(eval_ctx,(sexp)0x0,2,psVar3,(sexp)0x0);
    }
    else {
      psVar3 = sexp_env_cell_loc(eval_ctx,(eval_ctx->value).type.cpl,psVar3,0,(sexp_conflict *)0x0);
      if (psVar3 == (sexp)0x0) {
        psVar3 = (sexp)&DAT_0000003e;
      }
      else {
        psVar3 = (psVar3->value).type.cpl;
      }
    }
    local_60 = psVar3;
    if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x14)) {
      psVar4 = (eval_ctx->value).type.cpl;
      local_60 = sexp_alloc_tagged_aux(eval_ctx,0x28,0x15);
      (local_60->value).type.cpl = psVar4;
      (local_60->value).type.name = psVar3;
      (local_60->value).bytecode.length = 0x3e;
    }
    if (((ulong)local_60 & 3) != 0) {
LAB_0012cbc3:
      message = "non-procedure macro";
      psVar3 = local_60;
      goto LAB_0012cb92;
    }
    sVar1 = local_60->tag;
    if ((sVar1 != 0x15) && (sVar1 != 0x19)) {
      if (sVar1 != 0x13) goto LAB_0012cbc3;
      goto LAB_0012cba0;
    }
    psVar3 = (ls->value).type.name;
    psVar4 = (psVar3->value).type.name;
    if (((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 0x16)) &&
       ((((bind_ctx->value).type.cpl)->value).type.name == (sexp)0x0)) {
      psVar4 = (psVar4->value).type.slots;
    }
    if (((sVar1 == 0x15) &&
        (psVar3 = (((psVar3->value).type.cpl)->value).type.name, ((ulong)psVar3 & 3) == 0)) &&
       (psVar3->tag == 6)) {
      (local_60->value).type.slots = (psVar3->value).type.slots;
    }
    if (localp == 0) {
      sexp_env_define(eval_ctx,(bind_ctx->value).type.cpl,psVar4,local_60);
    }
    else {
      local_58 = sexp_cons_op(eval_ctx,(sexp)0x0,2,psVar4,local_60);
      (local_58->value).type.slots = (((bind_ctx->value).type.cpl)->value).type.slots;
      (((bind_ctx->value).type.cpl)->value).type.slots = local_58;
    }
    ls = (ls->value).type.cpl;
  } while( true );
}

Assistant:

static sexp analyze_bind_syntax (sexp ls, sexp eval_ctx, sexp bind_ctx, int localp) {
  sexp res = SEXP_VOID, name;
  sexp_gc_var2(mac, tmp);
  sexp_gc_preserve2(eval_ctx, mac, tmp);
  for ( ; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    if (! (sexp_pairp(sexp_car(ls)) && sexp_pairp(sexp_cdar(ls))
           && sexp_idp(sexp_caar(ls)) && sexp_nullp(sexp_cddar(ls)))) {
      res = sexp_compile_error(eval_ctx, "bad syntax binding", sexp_pairp(ls) ? sexp_car(ls) : ls);
      break;
    }
    if (sexp_idp(sexp_cadar(ls)))
      mac = sexp_env_ref(eval_ctx, sexp_context_env(eval_ctx), sexp_cadar(ls), SEXP_FALSE);
    else
      mac = sexp_eval(eval_ctx, sexp_cadar(ls), NULL);
    if (sexp_procedurep(mac))
      mac = sexp_make_macro(eval_ctx, mac, sexp_context_env(eval_ctx));
    if (!(sexp_macrop(mac)||sexp_corep(mac))) {
      res = (sexp_exceptionp(mac) ? mac
             : sexp_compile_error(eval_ctx, "non-procedure macro", mac));
      break;
    }
    name = sexp_caar(ls);
    if (sexp_synclop(name) && sexp_env_global_p(sexp_context_env(bind_ctx)))
      name = sexp_synclo_expr(name);
    if (sexp_macrop(mac) && sexp_pairp(sexp_cadar(ls)))
      sexp_macro_source(mac) = sexp_pair_source(sexp_cadar(ls));
    if (localp)
      sexp_env_push(eval_ctx, sexp_context_env(bind_ctx), tmp, name, mac);
    else
      sexp_env_define(eval_ctx, sexp_context_env(bind_ctx), name, mac);
#if !SEXP_USE_STRICT_TOPLEVEL_BINDINGS
    if (localp)
      sexp_env_cell_syntactic_p(sexp_env_cell(eval_ctx, sexp_context_env(bind_ctx), name, 0)) = 1;
#endif
  }
  sexp_gc_release2(eval_ctx);
  return res;
}